

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall cmCommandArgumentParserHelper::Error(cmCommandArgumentParserHelper *this,char *str)

{
  ostream *poVar1;
  ostringstream ostr;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,str);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  SetError(this,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::Error(const char* str)
{
  auto pos = this->InputBufferPos;
  auto const isEof = (this->InputSize < this->InputBufferPos);
  if (!isEof) {
    pos -= this->LastTokenLength;
  }

  std::ostringstream ostr;
  ostr << str << " (" << pos << ")";
  this->SetError(ostr.str());
}